

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

void __thiscall
Protocol::MQTT::Common::DynamicString::from(DynamicString *this,char *str,size_t len)

{
  size_t sVar1;
  char *__dest;
  ulong __size;
  
  free(this->data);
  this->length = 0;
  if (len == 0) {
    sVar1 = strlen(str);
    len = sVar1 + 1;
  }
  this->length = (uint16)len;
  __size = len & 0xffff;
  __dest = (char *)malloc(__size);
  this->data = __dest;
  memcpy(__dest,str,__size);
  __dest[__size - 1] = '\0';
  return;
}

Assistant:

void from(const char * str, const size_t len = 0) { this->~DynamicString(); length = len ? len : (strlen(str)+1); data = (char*)Platform::malloc(length); memcpy(data, str, length); data[length - 1] = 0; }